

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree_test.cc
# Opt level: O0

void __thiscall
phmap::priv::anon_unknown_0::Btree_HeterogeneousLookupDoesntDegradePerformance_Test::
~Btree_HeterogeneousLookupDoesntDegradePerformance_Test
          (Btree_HeterogeneousLookupDoesntDegradePerformance_Test *this)

{
  Btree_HeterogeneousLookupDoesntDegradePerformance_Test *this_local;
  
  ~Btree_HeterogeneousLookupDoesntDegradePerformance_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Btree, HeterogeneousLookupDoesntDegradePerformance) {
        using StringSet = phmap::btree_set<StringLike>;
        StringSet s;
        for (int i = 0; i < 100; ++i) {
            ASSERT_TRUE(s.insert(std::to_string(i).c_str()).second);
        }
        StringLike::clear_constructor_call_count();
        s.find("50");
        ASSERT_EQ(1, StringLike::constructor_calls());

        StringLike::clear_constructor_call_count();
        s.contains("50");
        ASSERT_EQ(1, StringLike::constructor_calls());

        StringLike::clear_constructor_call_count();
        s.count("50");
        ASSERT_EQ(1, StringLike::constructor_calls());

        StringLike::clear_constructor_call_count();
        s.lower_bound("50");
        ASSERT_EQ(1, StringLike::constructor_calls());

        StringLike::clear_constructor_call_count();
        s.upper_bound("50");
        ASSERT_EQ(1, StringLike::constructor_calls());

        StringLike::clear_constructor_call_count();
        s.equal_range("50");
        ASSERT_EQ(1, StringLike::constructor_calls());

        StringLike::clear_constructor_call_count();
        s.erase("50");
        ASSERT_EQ(1, StringLike::constructor_calls());
    }